

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

void xmlXPathCompUnionExpr(xmlXPathParserContextPtr ctxt)

{
  int ch1;
  bool bVar1;
  int op1;
  xmlXPathParserContextPtr ctxt_local;
  
  xmlXPathCompPathExpr(ctxt);
  if (ctxt->error == 0) {
    while( true ) {
      bVar1 = true;
      if ((*ctxt->cur != ' ') && ((*ctxt->cur < 9 || (bVar1 = true, 10 < *ctxt->cur)))) {
        bVar1 = *ctxt->cur == '\r';
      }
      if (!bVar1) break;
      if (*ctxt->cur != '\0') {
        ctxt->cur = ctxt->cur + 1;
      }
    }
    while (*ctxt->cur == '|') {
      ch1 = ctxt->comp->last;
      xmlXPathCompExprAdd(ctxt,-1,-1,XPATH_OP_NODE,0,0,0,(void *)0x0,(void *)0x0);
      if (*ctxt->cur != '\0') {
        ctxt->cur = ctxt->cur + 1;
      }
      while( true ) {
        bVar1 = true;
        if ((*ctxt->cur != ' ') && ((*ctxt->cur < 9 || (bVar1 = true, 10 < *ctxt->cur)))) {
          bVar1 = *ctxt->cur == '\r';
        }
        if (!bVar1) break;
        if (*ctxt->cur != '\0') {
          ctxt->cur = ctxt->cur + 1;
        }
      }
      xmlXPathCompPathExpr(ctxt);
      xmlXPathCompExprAdd(ctxt,ch1,ctxt->comp->last,XPATH_OP_UNION,0,0,0,(void *)0x0,(void *)0x0);
      while( true ) {
        bVar1 = true;
        if ((*ctxt->cur != ' ') && ((*ctxt->cur < 9 || (bVar1 = true, 10 < *ctxt->cur)))) {
          bVar1 = *ctxt->cur == '\r';
        }
        if (!bVar1) break;
        if (*ctxt->cur != '\0') {
          ctxt->cur = ctxt->cur + 1;
        }
      }
    }
  }
  return;
}

Assistant:

static void
xmlXPathCompUnionExpr(xmlXPathParserContextPtr ctxt) {
    xmlXPathCompPathExpr(ctxt);
    CHECK_ERROR;
    SKIP_BLANKS;
    while (CUR == '|') {
	int op1 = ctxt->comp->last;
	PUSH_LEAVE_EXPR(XPATH_OP_NODE, 0, 0);

	NEXT;
	SKIP_BLANKS;
	xmlXPathCompPathExpr(ctxt);

	PUSH_BINARY_EXPR(XPATH_OP_UNION, op1, ctxt->comp->last, 0, 0);

	SKIP_BLANKS;
    }
}